

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_transaction_commit_riscv64(MemoryRegion_conflict *mr)

{
  uc_struct_conflict12 *puVar1;
  AddressSpace *pAVar2;
  MemoryListener *pMVar3;
  MemoryRegion_conflict *mr_00;
  gpointer pvVar4;
  anon_union_16_2_aaf24f3d_for_link *paVar5;
  anon_union_16_2_aaf24f3d_for_address_spaces_link *paVar6;
  
  puVar1 = mr->uc;
  if (puVar1->memory_region_update_pending == true) {
    if (puVar1->flat_views != (GHashTable *)0x0) {
      g_hash_table_destroy(puVar1->flat_views);
      puVar1->flat_views = (GHashTable *)0x0;
    }
    flatviews_init((uc_struct_conflict13 *)puVar1);
    paVar6 = (anon_union_16_2_aaf24f3d_for_address_spaces_link *)&puVar1->address_spaces;
    while (pAVar2 = paVar6->tqe_next, pAVar2 != (AddressSpace *)0x0) {
      mr_00 = memory_region_get_flatview_root(pAVar2->root);
      pvVar4 = g_hash_table_lookup(puVar1->flat_views,mr_00);
      if (pvVar4 == (gpointer)0x0) {
        generate_memory_topology((uc_struct_conflict13 *)puVar1,mr_00);
      }
      paVar6 = &pAVar2->address_spaces_link;
    }
    paVar5 = (anon_union_16_2_aaf24f3d_for_link *)&mr->uc->memory_listeners;
    while (pMVar3 = paVar5->tqe_next, pMVar3 != (MemoryListener *)0x0) {
      if (pMVar3->begin != (_func_void_MemoryListener_ptr *)0x0) {
        (*pMVar3->begin)(pMVar3);
      }
      paVar5 = &pMVar3->link;
    }
    paVar6 = (anon_union_16_2_aaf24f3d_for_address_spaces_link *)&mr->uc->address_spaces;
    while (pAVar2 = paVar6->tqe_next, pAVar2 != (AddressSpace *)0x0) {
      address_space_set_flatview(pAVar2);
      paVar6 = &pAVar2->address_spaces_link;
    }
    puVar1 = mr->uc;
    puVar1->memory_region_update_pending = false;
    paVar5 = (anon_union_16_2_aaf24f3d_for_link *)&puVar1->memory_listeners;
    while (pMVar3 = paVar5->tqe_next, pMVar3 != (MemoryListener *)0x0) {
      if (pMVar3->commit != (_func_void_MemoryListener_ptr *)0x0) {
        (*pMVar3->commit)(pMVar3);
      }
      paVar5 = &pMVar3->link;
    }
  }
  return;
}

Assistant:

void memory_region_transaction_commit(MemoryRegion *mr)
{
    AddressSpace *as;

    if (mr->uc->memory_region_update_pending) {
        flatviews_reset(mr->uc);

        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, begin, Forward);

        QTAILQ_FOREACH(as, &mr->uc->address_spaces, address_spaces_link) {
            address_space_set_flatview(as);
        }
        mr->uc->memory_region_update_pending = false;
        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, commit, Forward);
    }
}